

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functionals.c
# Opt level: O0

int xc_func_init(xc_func_type *func,int functional,int nspin)

{
  int number_00;
  xc_func_info_type *__dest;
  double *pdVar1;
  char *__ptr;
  xc_func_type *func_00;
  int in_EDX;
  int in_ESI;
  xc_func_type *in_RDI;
  double dVar2;
  char *name_1;
  char *name;
  int i;
  xc_func_info_type *finfo;
  int number;
  uint uVar3;
  xc_func_type *in_stack_ffffffffffffffc0;
  double *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int local_1c;
  int local_18;
  int local_14;
  xc_func_type *local_10;
  
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  xc_func_nullify(in_RDI);
  local_10->nspin = local_18;
  __dest = (xc_func_info_type *)malloc(0xa0);
  uVar3 = 0;
  memset(&local_10->dim,0,0x128);
  number_00 = xc_family_from_id(local_14,(int *)(ulong)uVar3,&local_1c);
  if (number_00 == 1) {
    memcpy(__dest,xc_lda_known_funct[local_1c],0xa0);
    internal_counters_set_lda(local_10->nspin,&local_10->dim);
  }
  else if (number_00 == 2) {
    memcpy(__dest,xc_gga_known_funct[local_1c],0xa0);
    internal_counters_set_gga
              ((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
               (xc_dimensions *)CONCAT44(number_00,uVar3));
  }
  else if (number_00 == 4) {
    memcpy(__dest,xc_mgga_known_funct[local_1c],0xa0);
    internal_counters_set_mgga
              ((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
               (xc_dimensions *)CONCAT44(number_00,uVar3));
  }
  else if (number_00 == 0x20) {
    memcpy(__dest,xc_hyb_gga_known_funct[local_1c],0xa0);
    internal_counters_set_gga
              ((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
               (xc_dimensions *)CONCAT44(number_00,uVar3));
  }
  else if (number_00 == 0x40) {
    memcpy(__dest,xc_hyb_mgga_known_funct[local_1c],0xa0);
    internal_counters_set_mgga
              ((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
               (xc_dimensions *)CONCAT44(number_00,uVar3));
  }
  else {
    if (number_00 != 0x80) {
      return -2;
    }
    memcpy(__dest,xc_hyb_lda_known_funct[local_1c],0xa0);
    internal_counters_set_lda(local_10->nspin,&local_10->dim);
  }
  local_10->info = __dest;
  local_10->info->flags = local_10->info->flags | 0x20000;
  local_10->dens_threshold = local_10->info->dens_threshold;
  dVar2 = pow(local_10->info->dens_threshold,1.3333333333333333);
  local_10->sigma_threshold = dVar2;
  local_10->zeta_threshold = 2.220446049250313e-16;
  local_10->tau_threshold = 1e-20;
  if (local_10->info->init != (_func_void_xc_func_type_ptr *)0x0) {
    (*local_10->info->init)(local_10);
  }
  if (0 < (local_10->info->ext_params).n) {
    pdVar1 = (double *)malloc((long)(local_10->info->ext_params).n << 3);
    local_10->ext_params = pdVar1;
    xc_func_set_ext_params
              ((xc_func_type *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8);
    for (uVar3 = 0; (int)uVar3 < (local_10->info->ext_params).n; uVar3 = uVar3 + 1) {
      if ((local_10->info->ext_params).names[(int)uVar3] == (char *)0x0) {
        __ptr = xc_functional_get_name(number_00);
        fprintf(_stderr,"Internal error in %s: external parameter %i name is NULL\n",__ptr,
                (ulong)uVar3);
        free(__ptr);
        xc_func_end(in_stack_ffffffffffffffc0);
        return -1;
      }
      if ((local_10->info->ext_params).descriptions[(int)uVar3] == (char *)0x0) {
        func_00 = (xc_func_type *)xc_functional_get_name(number_00);
        fprintf(_stderr,"Internal error in %s: external parameter %i description is NULL\n",func_00,
                (ulong)uVar3);
        free(func_00);
        xc_func_end(func_00);
        return -1;
      }
    }
  }
  return 0;
}

Assistant:

int xc_func_init(xc_func_type *func, int functional, int nspin)
{
  int number;

  assert(func != NULL);
  assert(nspin==XC_UNPOLARIZED || nspin==XC_POLARIZED);

  xc_func_nullify(func);

  /* initialize structure */
  func->nspin       = nspin;

  // we have to make a copy because the *_known_funct arrays live in
  // host memory (libxc_malloc instead returns memory than can be read
  // from GPU and CPU).
  xc_func_info_type * finfo = (xc_func_info_type *) libxc_malloc(sizeof(xc_func_info_type));

  // initialize the dimension structure
  libxc_memset(&(func->dim), 0, sizeof(xc_dimensions));
  switch(xc_family_from_id(functional, NULL, &number)){
  case(XC_FAMILY_LDA):
    *finfo = *xc_lda_known_funct[number];
    internal_counters_set_lda(func->nspin, &(func->dim));
    break;

  case(XC_FAMILY_HYB_LDA):
    *finfo = *xc_hyb_lda_known_funct[number];
    internal_counters_set_lda(func->nspin, &(func->dim));
    break;

  case(XC_FAMILY_GGA):
    *finfo = *xc_gga_known_funct[number];
    internal_counters_set_gga(func->nspin, &(func->dim));
    break;

  case(XC_FAMILY_HYB_GGA):
    *finfo = *xc_hyb_gga_known_funct[number];
    internal_counters_set_gga(func->nspin, &(func->dim));
    break;

  case(XC_FAMILY_MGGA):
    *finfo = *xc_mgga_known_funct[number];
    internal_counters_set_mgga(func->nspin, &(func->dim));
    break;

  case(XC_FAMILY_HYB_MGGA):
    *finfo = *xc_hyb_mgga_known_funct[number];
    internal_counters_set_mgga(func->nspin, &(func->dim));
    break;

  default:
    return -2; /* family not found */
  }
  func->info = finfo;

#ifdef XC_ENFORCE_FERMI_HOLE_CURVATURE
  /* Set the flag to enforce Fermi curvature by default */
  func->info->flags = func->info->flags | XC_FLAGS_ENFORCE_FHC;
#endif

  /* this is initialized for each functional from the info */
  func->dens_threshold = func->info->dens_threshold;
  /* the density and sigma cutoffs should be connected, especially in
     the case of kinetic energy functionals. This is the correct
     scaling */
  func->sigma_threshold = pow(func->info->dens_threshold, 4.0/3.0);

  /* these are reasonable defaults */
  func->zeta_threshold  = DBL_EPSILON;
  func->tau_threshold   = 1e-20;

  /* see if we need to initialize the functional */
  if(func->info->init != NULL)
    func->info->init(func);

  /* see if we need to initialize the external parameters */
  if(func->info->ext_params.n > 0) {
    func->ext_params = (double *) libxc_malloc(func->info->ext_params.n * sizeof(double));
    xc_func_set_ext_params(func, func->info->ext_params.values);

    /* sanity check external parameter names and descriptions */
    for(int i=0; i<func->info->ext_params.n; i++) {
      if(func->info->ext_params.names[i] == NULL) {
        char * name = xc_functional_get_name(functional);
        fprintf(stderr,"Internal error in %s: external parameter %i name is NULL\n",name,i);
        free(name);
        xc_func_end(func);
        return -1;
      }
      if(func->info->ext_params.descriptions[i] == NULL) {
        char * name = xc_functional_get_name(functional);
        fprintf(stderr,"Internal error in %s: external parameter %i description is NULL\n",name,i);
        free(name);
        xc_func_end(func);
        return -1;
      }
    }
  }

  return 0;
}